

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMHighLevelEncoder.cpp
# Opt level: O1

string * __thiscall
ZXing::DataMatrix::ToHexString_abi_cxx11_(string *__return_storage_ptr__,DataMatrix *this,int c)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x04');
  (__return_storage_ptr__->_M_dataplus)._M_p[1] = 'x';
  (__return_storage_ptr__->_M_dataplus)._M_p[2] =
       "0123456789abcdef"[(uint)(((ulong)this & 0xffffffff) >> 4) & 0xf];
  (__return_storage_ptr__->_M_dataplus)._M_p[3] = "0123456789abcdef"[(uint)this & 0xf];
  return __return_storage_ptr__;
}

Assistant:

static std::string ToHexString(int c)
{
	const char* digits = "0123456789abcdef";
	std::string val(4, '0');
	val[1] = 'x';
	val[2] = digits[(c >> 4) & 0xf];
	val[3] = digits[c & 0xf];
	return val;
}